

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

BrokerObject * helics::getBrokerObject(HelicsBroker broker,HelicsError *err)

{
  if (err == (HelicsError *)0x0) {
    if ((broker != (HelicsBroker)0x0) && (*(int *)((long)broker + 0x14) == -0x5cb982e0)) {
      return (BrokerObject *)broker;
    }
  }
  else if (err->error_code == 0) {
    if ((broker != (HelicsBroker)0x0) && (*(int *)((long)broker + 0x14) == -0x5cb982e0)) {
      return (BrokerObject *)broker;
    }
    err->error_code = -3;
    err->message = "broker object is not valid";
  }
  return (BrokerObject *)0x0;
}

Assistant:

BrokerObject* getBrokerObject(HelicsBroker broker, HelicsError* err) noexcept
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (broker == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidBrokerString);
        return nullptr;
    }
    auto* brokerObj = reinterpret_cast<helics::BrokerObject*>(broker);
    if (brokerObj->valid == gBrokerValidationIdentifier) {
        return brokerObj;
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidBrokerString);
    return nullptr;
}